

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall util_tests::test_Capitalize::test_method(test_Capitalize *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  char *in_stack_fffffffffffffd58;
  char *in_stack_fffffffffffffd60;
  char *in_stack_fffffffffffffd68;
  string *in_stack_fffffffffffffd70;
  const_string *in_stack_fffffffffffffd80;
  size_t in_stack_fffffffffffffd88;
  size_t line_num;
  const_string *in_stack_fffffffffffffd90;
  const_string *file;
  allocator<char> *in_stack_fffffffffffffd98;
  allocator<char> *__a;
  char *in_stack_fffffffffffffda0;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  const_string local_1c9;
  undefined1 local_1b8 [32];
  allocator<char> local_198 [16];
  const_string local_188;
  allocator<char> local_171;
  undefined1 local_170 [16];
  undefined1 local_160 [71];
  allocator<char> local_119;
  undefined1 local_118 [16];
  undefined1 local_108 [96];
  undefined1 local_a8 [64];
  undefined1 local_68 [64];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
               (unsigned_long)in_stack_fffffffffffffd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
               in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffd60,(char (*) [1])in_stack_fffffffffffffd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
               (unsigned_long)in_stack_fffffffffffffd58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    Capitalize(in_stack_fffffffffffffd70);
    in_stack_fffffffffffffd68 = "\"\"";
    in_stack_fffffffffffffd60 = "";
    in_stack_fffffffffffffd58 = "Capitalize(\"\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
              (local_108,local_118,0x50f,1,2,local_28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd58);
    std::allocator<char>::~allocator(&local_119);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffd58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
               (unsigned_long)in_stack_fffffffffffffd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
               in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffd60,(char (*) [1])in_stack_fffffffffffffd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
               (unsigned_long)in_stack_fffffffffffffd58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    Capitalize(in_stack_fffffffffffffd70);
    in_stack_fffffffffffffd68 = "\"Bitcoin\"";
    in_stack_fffffffffffffd60 = "Bitcoin";
    in_stack_fffffffffffffd58 = "Capitalize(\"bitcoin\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[8]>
              (local_160,local_170,0x510,1,2,local_68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd58);
    std::allocator<char>::~allocator(&local_171);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffd58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    __s = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    file = &local_188;
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x63;
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
               (unsigned_long)in_stack_fffffffffffffd58);
    __a = local_198;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)__a,file,line_num,in_stack_fffffffffffffd80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffd60,(char (*) [1])in_stack_fffffffffffffd58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
               (unsigned_long)in_stack_fffffffffffffd58);
    in_stack_fffffffffffffd80 = &local_1c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_00,__s,__a);
    Capitalize(in_stack_fffffffffffffd70);
    in_stack_fffffffffffffd68 = "\"\\x00\\xfe\\xff\"";
    in_stack_fffffffffffffd60 = "";
    in_stack_fffffffffffffd58 = "Capitalize(\"\\x00\\xfe\\xff\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[4]>
              (local_1b8,(undefined1 *)((long)&local_1c9.m_begin + 1),0x511,1,2,local_a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd58);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffd58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_Capitalize)
{
    BOOST_CHECK_EQUAL(Capitalize(""), "");
    BOOST_CHECK_EQUAL(Capitalize("bitcoin"), "Bitcoin");
    BOOST_CHECK_EQUAL(Capitalize("\x00\xfe\xff"), "\x00\xfe\xff");
}